

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

char * duckdb_snappy::internal::CompressFragmentDoubleHash
                 (char *input,size_t input_size,char *op,uint16_t *table,int table_size,
                 uint16_t *table2,int table_size2)

{
  long *s2_limit;
  size_t sVar1;
  ulong uVar2;
  long *plVar3;
  ulong uVar4;
  short sVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  long *plVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  char *pcVar13;
  short sVar14;
  long *literal;
  
  s2_limit = (long *)(input + input_size);
  literal = (long *)input;
  if (input_size < 0xf) {
LAB_01e1857a:
    if (s2_limit <= literal) {
      return op;
    }
    pcVar10 = EmitLiteral<false>(op,(char *)literal,(int)s2_limit - (int)literal);
    return pcVar10;
  }
  uVar8 = table_size * 2 - 2;
LAB_01e1824b:
  uVar11 = 0x200;
  plVar3 = (long *)((long)literal + 1);
  do {
    plVar9 = plVar3;
    plVar3 = (long *)((ulong)(uVar11 >> 9) + (long)plVar9);
    if ((long *)((long)s2_limit - 0xfU) < plVar3) goto LAB_01e1857a;
    lVar12 = *plVar9;
    uVar2 = (ulong)((uint)((ulong)(lVar12 * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
    uVar7 = (ulong)*(ushort *)(uVar2 + (long)table2);
    sVar14 = (short)plVar9 - (short)input;
    *(short *)(uVar2 + (long)table2) = sVar14;
    iVar6 = (int)lVar12;
    if (*(int *)(input + uVar7) == iVar6) {
      sVar1 = FindMatchLengthPlain(input + uVar7 + 4,(char *)((long)plVar9 + 4),(char *)s2_limit);
      uVar2 = (ulong)((int)sVar1 + 4);
      goto LAB_01e1837c;
    }
    uVar2 = (ulong)((uint)(iVar6 * -0x61c8864f) >> 0x11 & uVar8);
    uVar7 = (ulong)*(ushort *)(uVar2 + (long)table);
    *(short *)(uVar2 + (long)table) = sVar14;
    uVar11 = uVar11 + 1;
  } while (*(int *)(input + uVar7) != iVar6);
  sVar1 = FindMatchLengthPlain(input + uVar7 + 4,(char *)((long)plVar9 + 4),(char *)s2_limit);
  uVar2 = (ulong)((int)sVar1 + 4);
  uVar4 = (ulong)((uint)((ulong)(*(long *)((long)plVar9 + 1) * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
  pcVar10 = input + *(ushort *)(uVar4 + (long)table2);
  sVar1 = FindMatchLengthPlain(pcVar10,(char *)((long)plVar9 + 1),(char *)s2_limit);
  if (uVar2 < sVar1) {
    *(short *)((long)table2 + uVar4) = sVar14;
    uVar2 = sVar1 & 0xffffffff;
    plVar9 = (long *)((long)plVar9 + 1);
  }
  else {
LAB_01e1837c:
    pcVar10 = input + uVar7;
  }
  lVar12 = 0;
  while( true ) {
    pcVar13 = pcVar10 + lVar12;
    if (((pcVar13 <= input) || ((long *)(lVar12 + (long)plVar9) <= literal)) ||
       (*(char *)((long)plVar9 + lVar12 + -1) != pcVar10[lVar12 + -1])) break;
    lVar12 = lVar12 + -1;
  }
  sVar14 = (short)plVar9 - (short)input;
  sVar5 = (short)lVar12 + sVar14 + 1;
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)plVar9 + lVar12 + 1) * 0xcf1bbcdcbfa563) >> 0x31
                           ) & uVar8) + (long)table2) = sVar5;
  *(short *)((ulong)((uint)((ulong)(*(long *)((long)plVar9 + lVar12 + 2) * 0xcf1bbcdcbfa563) >> 0x31
                           ) & uVar8) + (long)table2) = sVar14 + (short)lVar12 + 2;
  *(short *)((ulong)((uint)(*(int *)((long)plVar9 + lVar12 + 1) * -0x61c8864f) >> 0x11 & uVar8) +
            (long)table) = sVar5;
  if (0 < (long)((long)plVar9 + (lVar12 - (long)literal))) {
    op = EmitLiteral<true>(op,(char *)literal,(int)lVar12 + ((int)plVar9 - (int)literal));
  }
  uVar2 = uVar2 - lVar12;
  literal = (long *)(lVar12 + (long)plVar9);
  do {
    uVar7 = uVar2 & 0xffffffff;
    if ((uint)uVar2 < 0xc) {
      op = EmitCopyAtMost64<true>(op,(long)literal - (long)pcVar13,uVar7);
    }
    else {
      op = EmitCopy<false>(op,(long)literal - (long)pcVar13,uVar7);
    }
    literal = (long *)((long)literal + uVar7);
    if ((long *)((long)s2_limit - 0xfU) <= literal) goto LAB_01e1857a;
    sVar14 = (short)((long)literal - (long)input);
    if (7 < (long)literal - (long)input) {
      *(short *)((ulong)((uint)((ulong)(*(long *)((long)literal + -7) * 0xcf1bbcdcbfa563) >> 0x31) &
                        uVar8) + (long)table2) = sVar14 + -7;
      *(short *)((ulong)((uint)((ulong)(*(long *)((long)literal + -4) * 0xcf1bbcdcbfa563) >> 0x31) &
                        uVar8) + (long)table2) = sVar14 + -4;
    }
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)literal + -3) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar8) + (long)table2) = sVar14 + -3;
    *(short *)((ulong)((uint)((ulong)(*(long *)((long)literal + -2) * 0xcf1bbcdcbfa563) >> 0x31) &
                      uVar8) + (long)table2) = sVar14 + -2;
    *(short *)((ulong)((uint)(*(int *)((long)literal + -2) * -0x61c8864f) >> 0x11 & uVar8) +
              (long)table) = sVar14 + -2;
    *(short *)((ulong)((uint)(*(int *)((long)literal + -1) * -0x61c8864f) >> 0x11 & uVar8) +
              (long)table) = sVar14 + -1;
    uVar2 = (ulong)((uint)((ulong)(*literal * 0xcf1bbcdcbfa563) >> 0x31) & uVar8);
    uVar7 = (ulong)*(ushort *)(uVar2 + (long)table2);
    *(short *)(uVar2 + (long)table2) = sVar14;
    if ((int)*literal != *(int *)(input + uVar7)) {
      uVar2 = (ulong)((uint)((int)*literal * -0x61c8864f) >> 0x11 & uVar8);
      uVar7 = (ulong)*(ushort *)(uVar2 + (long)table);
      *(short *)(uVar2 + (long)table) = sVar14;
      if ((int)*literal != *(int *)(input + uVar7)) goto LAB_01e1824b;
    }
    pcVar13 = input + uVar7;
    sVar1 = FindMatchLengthPlain(pcVar13 + 4,(char *)((long)literal + 4),(char *)s2_limit);
    uVar2 = (ulong)((int)sVar1 + 4);
  } while( true );
}

Assistant:

char* CompressFragmentDoubleHash(const char* input, size_t input_size, char* op,
                                 uint16_t* table, const int table_size,
                                 uint16_t* table2, const int table_size2) {
  (void)table_size2;
  assert(table_size == table_size2);
  // "ip" is the input pointer, and "op" is the output pointer.
  const char* ip = input;
  assert(input_size <= kBlockSize);
  assert((table_size & (table_size - 1)) == 0);  // table must be power of two
  const uint32_t mask = 2 * (table_size - 1);
  const char* ip_end = input + input_size;
  const char* base_ip = ip;

  const size_t kInputMarginBytes = 15;
  if (SNAPPY_PREDICT_TRUE(input_size >= kInputMarginBytes)) {
    const char* ip_limit = input + input_size - kInputMarginBytes;

    for (;;) {
      const char* next_emit = ip++;
      uint64_t data = LittleEndian::Load64(ip);
      uint32_t skip = 512;

      const char* candidate;
      uint32_t candidate_length;
      while (true) {
        assert(static_cast<uint32_t>(data) == LittleEndian::Load32(ip));
        uint16_t* table_entry2 = TableEntry8ByteMatch(table2, data, mask);
        uint32_t bytes_between_hash_lookups = skip >> 9;
        skip++;
        const char* next_ip = ip + bytes_between_hash_lookups;
        if (SNAPPY_PREDICT_FALSE(next_ip > ip_limit)) {
          ip = next_emit;
          goto emit_remainder;
        }
        candidate = base_ip + *table_entry2;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry2 = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          break;
        }

        uint16_t* table_entry = TableEntry4ByteMatch(table, data, mask);
        candidate = base_ip + *table_entry;
        assert(candidate >= base_ip);
        assert(candidate < ip);

        *table_entry = ip - base_ip;
        if (SNAPPY_PREDICT_FALSE(static_cast<uint32_t>(data) ==
                                LittleEndian::Load32(candidate))) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          table_entry2 =
              TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask);
          auto candidate2 = base_ip + *table_entry2;
          size_t candidate_length2 =
              FindMatchLengthPlain(candidate2, ip + 1, ip_end);
          if (candidate_length2 > candidate_length) {
            *table_entry2 = ip - base_ip;
            candidate = candidate2;
            candidate_length = candidate_length2;
            ++ip;
          }
          break;
        }
        data = LittleEndian::Load64(next_ip);
        ip = next_ip;
      }
      // Backtrack to the point it matches fully.
      while (ip > next_emit && candidate > base_ip &&
             *(ip - 1) == *(candidate - 1)) {
        --ip;
        --candidate;
        ++candidate_length;
      }
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 1), mask) =
          ip - base_ip + 1;
      *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip + 2), mask) =
          ip - base_ip + 2;
      *TableEntry4ByteMatch(table, LittleEndian::Load32(ip + 1), mask) =
          ip - base_ip + 1;
      // Step 2: A 4-byte or 8-byte match has been found.
      // We'll later see if more than 4 bytes match.  But, prior to the match,
      // input bytes [next_emit, ip) are unmatched.  Emit them as
      // "literal bytes."
      assert(next_emit + 16 <= ip_end);
      if (ip - next_emit > 0) {
        op = EmitLiteral</*allow_fast_path=*/true>(op, next_emit,
                                                   ip - next_emit);
      }
      // Step 3: Call EmitCopy, and then see if another EmitCopy could
      // be our next move.  Repeat until we find no match for the
      // input immediately after what was consumed by the last EmitCopy call.
      //
      // If we exit this loop normally then we need to call EmitLiteral next,
      // though we don't yet know how big the literal will be.  We handle that
      // by proceeding to the next iteration of the main loop.  We also can exit
      // this loop via goto if we get close to exhausting the input.
      do {
        // We have a 4-byte match at ip, and no need to emit any
        // "literal bytes" prior to ip.
        const char* base = ip;
        ip += candidate_length;
        size_t offset = base - candidate;
        if (candidate_length < 12) {
          op =
              EmitCopy</*len_less_than_12=*/true>(op, offset, candidate_length);
        } else {
          op = EmitCopy</*len_less_than_12=*/false>(op, offset,
                                                    candidate_length);
        }
        if (SNAPPY_PREDICT_FALSE(ip >= ip_limit)) {
          goto emit_remainder;
        }
        // We are now looking for a 4-byte match again.  We read
        // table[Hash(ip, mask)] for that. To improve compression,
        // we also update several previous table entries.
        if (ip - base_ip > 7) {
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 7), mask) =
              ip - base_ip - 7;
          *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 4), mask) =
              ip - base_ip - 4;
        }
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 3), mask) =
            ip - base_ip - 3;
        *TableEntry8ByteMatch(table2, LittleEndian::Load64(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 2), mask) =
            ip - base_ip - 2;
        *TableEntry4ByteMatch(table, LittleEndian::Load32(ip - 1), mask) =
            ip - base_ip - 1;

        uint16_t* table_entry =
            TableEntry8ByteMatch(table2, LittleEndian::Load64(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        table_entry =
            TableEntry4ByteMatch(table, LittleEndian::Load32(ip), mask);
        candidate = base_ip + *table_entry;
        *table_entry = ip - base_ip;
        if (LittleEndian::Load32(ip) == LittleEndian::Load32(candidate)) {
          candidate_length =
              FindMatchLengthPlain(candidate + 4, ip + 4, ip_end) + 4;
          continue;
        }
        break;
      } while (true);
    }
  }

emit_remainder:
  // Emit the remaining bytes as a literal
  if (ip < ip_end) {
    op = EmitLiteral</*allow_fast_path=*/false>(op, ip, ip_end - ip);
  }

  return op;
}